

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandDsdMerge(Abc_Frame_t *pAbc,int argc,char **argv)

{
  char **__filename;
  int iVar1;
  void *pvVar2;
  FILE *__stream;
  char *pcVar3;
  If_DsdMan_t *pNew;
  If_DsdMan_t *p;
  If_DsdMan_t *pDsdMan;
  FILE *pFile;
  int nArgcNew;
  int c;
  char **pArgvNew;
  char *pTemp;
  char *FileName;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  Extra_UtilGetoptReset();
  iVar1 = Extra_UtilGetopt(argc,argv,"h");
  if (iVar1 == -1) {
    pvVar2 = Abc_FrameReadManDsd();
    if (pvVar2 == (void *)0x0) {
      Abc_Print(-1,"The DSD manager is not started.\n");
      pAbc_local._4_4_ = 0;
    }
    else if (argc - globalUtilOptind == 1) {
      __filename = (char **)argv[globalUtilOptind];
      for (pArgvNew = __filename; *(char *)pArgvNew != '\0';
          pArgvNew = (char **)((long)pArgvNew + 1)) {
        if (*(char *)pArgvNew == '>') {
          *(undefined1 *)pArgvNew = 0x5c;
        }
      }
      __stream = fopen((char *)__filename,"r");
      if (__stream == (FILE *)0x0) {
        Abc_Print(-1,"Cannot open input file \"%s\". ",__filename);
        pcVar3 = Extra_FileGetSimilarName
                           ((char *)__filename,".aig",(char *)0x0,(char *)0x0,(char *)0x0,
                            (char *)0x0);
        if (pcVar3 != (char *)0x0) {
          Abc_Print(1,"Did you mean \"%s\"?",pcVar3);
        }
        Abc_Print(1,"\n");
        pAbc_local._4_4_ = 1;
      }
      else {
        fclose(__stream);
        pNew = If_DsdManLoad((char *)__filename);
        if (pNew == (If_DsdMan_t *)0x0) {
          pAbc_local._4_4_ = 1;
        }
        else {
          p = (If_DsdMan_t *)Abc_FrameReadManDsd();
          If_DsdManMerge(p,pNew);
          If_DsdManFree(pNew,0);
          pAbc_local._4_4_ = 0;
        }
      }
    }
    else {
      Abc_Print(-1,"File name is not given on the command line.\n");
      pAbc_local._4_4_ = 1;
    }
  }
  else {
    Abc_Print(-2,"usage: dsd_merge [-h] <file>\n");
    Abc_Print(-2,"\t         merges DSD manager from file with the current one\n");
    Abc_Print(-2,"\t-h     : print the command usage\n");
    Abc_Print(-2,"\t<file> : file name to read\n");
    pAbc_local._4_4_ = 1;
  }
  return pAbc_local._4_4_;
}

Assistant:

int Abc_CommandDsdMerge( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    char * FileName, * pTemp;
    char ** pArgvNew;
    int c, nArgcNew;
    FILE * pFile;
    If_DsdMan_t * pDsdMan;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "h" ) ) != EOF )
    {
        switch ( c )
        {
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( !Abc_FrameReadManDsd() )
    {
        Abc_Print( -1, "The DSD manager is not started.\n" );
        return 0;
    }
    pArgvNew = argv + globalUtilOptind;
    nArgcNew = argc - globalUtilOptind;
    if ( nArgcNew != 1 )
    {
        Abc_Print( -1, "File name is not given on the command line.\n" );
        return 1;
    }
    // get the input file name
    FileName = pArgvNew[0];
    // fix the wrong symbol
    for ( pTemp = FileName; *pTemp; pTemp++ )
        if ( *pTemp == '>' )
            *pTemp = '\\';
    if ( (pFile = fopen( FileName, "r" )) == NULL )
    {
        Abc_Print( -1, "Cannot open input file \"%s\". ", FileName );
        if ( (FileName = Extra_FileGetSimilarName( FileName, ".aig", NULL, NULL, NULL, NULL )) )
            Abc_Print( 1, "Did you mean \"%s\"?", FileName );
        Abc_Print( 1, "\n" );
        return 1;
    }
    fclose( pFile );
    pDsdMan = If_DsdManLoad(FileName);
    if ( pDsdMan == NULL )
        return 1;
    If_DsdManMerge( (If_DsdMan_t *)Abc_FrameReadManDsd(), pDsdMan );
    If_DsdManFree( pDsdMan, 0 );
    return 0;

usage:
    Abc_Print( -2, "usage: dsd_merge [-h] <file>\n" );
    Abc_Print( -2, "\t         merges DSD manager from file with the current one\n");
    Abc_Print( -2, "\t-h     : print the command usage\n");
    Abc_Print( -2, "\t<file> : file name to read\n");
    return 1;
}